

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t main(wchar_t argc,char **argv)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  test_list_t *ptVar5;
  char *pcVar6;
  tm *__tp;
  char *pcVar7;
  undefined8 *in_RSI;
  wchar_t test_num;
  sigaction sa;
  char *testprg;
  char tmpdir_timestamp [256];
  char *vlevel;
  char *tmp2;
  char *testprogdir;
  char *pwd;
  char tmpdir [256];
  char *p;
  char *option_arg;
  char *tmp;
  char **saved_argv;
  char *progname;
  char *refdir_alloc;
  time_t now;
  wchar_t option;
  wchar_t tests_failed;
  wchar_t tests_run;
  wchar_t j;
  wchar_t i;
  wchar_t test_set [52];
  char *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  test_list_t *in_stack_fffffffffffffbc0;
  test_list_t *in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffbd0;
  test_list_t *in_stack_fffffffffffffbd8;
  _union_1457 local_3f8;
  sigset_t sStack_3f0;
  undefined4 local_370;
  char *local_360;
  char local_358 [256];
  char *local_258;
  char *local_250;
  test_list_t *local_248;
  char *local_240;
  char local_238 [256];
  char *local_138;
  char *local_130;
  char *local_128;
  char *in_stack_fffffffffffffee0;
  long *plVar8;
  char *local_118;
  time_t local_108;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  int local_f0;
  uint local_ec;
  char *in_stack_ffffffffffffffe8;
  long *plVar9;
  
  local_ec = 0;
  local_f0 = 0;
  local_f4 = 0;
  local_f8 = 0;
  local_250 = (char *)0x0;
  local_258 = (char *)0x0;
  local_240 = getcwd((char *)0x0,0x1000);
  while (pcVar6 = local_240, sVar3 = strlen(local_240), pcVar7 = local_240,
        pcVar6[sVar3 - 1] == '\n') {
    sVar3 = strlen(local_240);
    pcVar7[sVar3 - 1] = '\0';
  }
  local_118 = (char *)*in_RSI;
  local_138 = local_118;
  sVar3 = strlen(local_118);
  local_248 = (test_list_t *)malloc(sVar3 + 1);
  if (local_248 == (test_list_t *)0x0) {
    fprintf(_stderr,"ERROR: Out of memory.");
    exit(1);
  }
  strcpy((char *)local_248,local_118);
  ptVar5 = local_248;
  for (; *local_138 != '\0'; local_138 = local_138 + 1) {
    if ((*local_138 == '/') || (*local_138 == '\\')) {
      local_118 = local_138 + 1;
      local_ec = local_f0;
    }
    local_f0 = local_f0 + 1;
  }
  *(char *)((long)&local_248->func + (long)(int)local_ec) = '\0';
  if (*(char *)&local_248->func != '/') {
    sVar3 = strlen(local_240);
    sVar4 = strlen((char *)local_248);
    ptVar5 = (test_list_t *)realloc(ptVar5,sVar3 + sVar4 + 2);
    local_248 = ptVar5;
    if (ptVar5 == (test_list_t *)0x0) {
      fprintf(_stderr,"ERROR: Out of memory.");
      exit(1);
    }
    sVar3 = strlen(local_240);
    in_stack_fffffffffffffbc0 = local_248;
    sVar4 = strlen((char *)local_248);
    memmove((void *)((long)&ptVar5->func + sVar3 + 1),in_stack_fffffffffffffbc0,sVar4);
    in_stack_fffffffffffffbc8 = local_248;
    in_stack_fffffffffffffbd0 = local_240;
    sVar3 = strlen(local_240);
    memcpy(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0,sVar3);
    in_stack_fffffffffffffbd8 = local_248;
    sVar3 = strlen(local_240);
    *(char *)((long)&in_stack_fffffffffffffbd8->func + sVar3) = '/';
  }
  testprogfile = getenv("BSDTAR");
  pcVar6 = getenv("TMPDIR");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = getenv("TMP");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = getenv("TEMP");
      if (pcVar6 == (char *)0x0) {
        pcVar6 = getenv("TEMPDIR");
        if (pcVar6 == (char *)0x0) {
          local_128 = "/tmp";
        }
        else {
          local_128 = getenv("TEMPDIR");
        }
      }
      else {
        local_128 = getenv("TEMP");
      }
    }
    else {
      local_128 = getenv("TMP");
    }
  }
  else {
    local_128 = getenv("TMPDIR");
  }
  pcVar6 = getenv("BSDTAR_DEBUG");
  if (pcVar6 != (char *)0x0) {
    dump_on_failure = L'\x01';
  }
  pcVar6 = getenv("_VERBOSITY_LEVEL");
  if (pcVar6 != (char *)0x0) {
    local_258 = getenv("_VERBOSITY_LEVEL");
    verbosity = atoi(local_258);
    if ((verbosity < L'\xffffffff') || (L'\x02' < verbosity)) {
      local_258 = (char *)0x0;
      verbosity = L'\0';
    }
  }
  refdir = getenv("BSDTAR_TEST_FILES");
  plVar8 = in_RSI + 1;
  while ((*plVar8 != 0 && (*(char *)*plVar8 == '-'))) {
    plVar9 = plVar8 + 1;
    local_138 = (char *)(*plVar8 + 1);
    while (plVar8 = plVar9, *local_138 != '\0') {
      pcVar6 = local_138 + 1;
      local_fc = (uint)*local_138;
      local_130 = (char *)0x0;
      local_138 = pcVar6;
      if ((local_fc == 0x70) || (local_fc == 0x72)) {
        if (*pcVar6 == '\0') {
          if (*plVar9 == 0) {
            fprintf(_stderr,"Option -%c requires argument.\n",(ulong)local_fc);
            usage(in_stack_fffffffffffffba0);
            pcVar6 = local_130;
          }
          else {
            pcVar6 = (char *)*plVar9;
            plVar9 = plVar9 + 1;
          }
        }
        local_130 = pcVar6;
        local_138 = "";
      }
      in_stack_fffffffffffffba8 = (char *)(ulong)(local_fc - 100);
      switch(in_stack_fffffffffffffba8) {
      case (char *)0x0:
        dump_on_failure = L'\x01';
        break;
      default:
        fprintf(_stderr,"Unrecognized option \'%c\'\n",(ulong)local_fc);
        usage(in_stack_fffffffffffffba0);
        break;
      case (char *)0x7:
        keep_temp_files = L'\x01';
        break;
      case (char *)0xc:
        testprogfile = local_130;
        break;
      case (char *)0xd:
        if (local_258 == (char *)0x0) {
          verbosity = verbosity + L'\xffffffff';
        }
        break;
      case (char *)0xe:
        refdir = local_130;
        break;
      case (char *)0x11:
        until_failure = until_failure + L'\x01';
        break;
      case (char *)0x12:
        if (local_258 == (char *)0x0) {
          verbosity = verbosity + L'\x01';
        }
      }
    }
  }
  if (testprogfile == (char *)0x0) {
    sVar3 = strlen((char *)local_248);
    local_250 = (char *)malloc(sVar3 + 8);
    if (local_250 == (char *)0x0) {
      fprintf(_stderr,"ERROR: Out of memory.");
      exit(1);
    }
    strcpy(local_250,(char *)local_248);
    strcat(local_250,"/");
    strcat(local_250,"bsdtar");
    testprogfile = local_250;
  }
  sVar3 = strlen(testprogfile);
  local_360 = (char *)malloc(sVar3 + 3);
  strcpy(local_360,"\"");
  strcat(local_360,testprogfile);
  strcat(local_360,"\"");
  testprog = local_360;
  local_3f8 = (_union_1457)0x1;
  sigemptyset(&sStack_3f0);
  local_370 = 0;
  sigaction(0xd,(sigaction *)&local_3f8,(sigaction *)0x0);
  local_108 = time((time_t *)0x0);
  local_ec = 0;
  while( true ) {
    pcVar6 = local_358;
    __tp = localtime(&local_108);
    strftime(pcVar6,0x100,"%Y-%m-%dT%H.%M.%S",__tp);
    sprintf(local_238,"%s/%s.%s-%03d",local_128,local_118,local_358,(ulong)local_ec);
    wVar1 = assertion_make_dir(in_stack_fffffffffffffba8,(wchar_t)((ulong)pcVar6 >> 0x20),
                               in_stack_fffffffffffffb98,L'\0');
    if (wVar1 != L'\0') break;
    if (0x3e6 < (int)local_ec) {
      fprintf(_stderr,"ERROR: Unable to create temp directory %s\n",local_238);
      exit(1);
    }
    local_ec = local_ec + 1;
  }
  pcVar7 = get_refdir(in_stack_fffffffffffffee0);
  refdir = pcVar7;
  printf("\n");
  printf("If tests fail or crash, details will be in:\n");
  printf("   %s\n",local_238);
  printf("\n");
  if (verbosity < L'\0') {
    printf("Running ");
    fflush(_stdout);
    plVar9 = plVar8;
  }
  else {
    printf("Reference files will be read from: %s\n",refdir);
    printf("Running tests on: %s\n",testprog);
    printf("Exercising: ");
    fflush(_stdout);
    systemf("%s --version",testprog);
    printf("%s\n","");
    plVar9 = plVar8;
  }
  do {
    iVar2 = get_test_set((int *)in_stack_fffffffffffffbd8,
                         (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                         (char *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    if (iVar2 < 0) {
      printf("*** INVALID Test %s\n",*plVar9);
      free(pcVar7);
      free(local_248);
      usage(pcVar6);
      return L'\x01';
    }
    for (local_ec = 0; (int)local_ec < iVar2; local_ec = local_ec + 1) {
      local_f4 = local_f4 + 1;
      wVar1 = test_run((wchar_t)((ulong)plVar9 >> 0x20),in_stack_ffffffffffffffe8);
      if ((wVar1 != L'\0') && (local_f8 = local_f8 + 1, until_failure != L'\0')) goto LAB_0010923a;
    }
    if (*plVar9 != 0) {
      plVar9 = plVar9 + 1;
    }
  } while ((*plVar9 != 0) || (plVar9 = plVar8, until_failure != L'\0'));
LAB_0010923a:
  free(local_250);
  free(local_248);
  free(local_240);
  if (L'\xffffffff' < verbosity) {
    printf("\n");
    printf("Totals:\n");
    printf("  Tests run:         %8d\n",(ulong)local_f4);
    printf("  Tests failed:      %8d\n",(ulong)local_f8);
    printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
    printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
    printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
  }
  wVar1 = (wchar_t)((ulong)pcVar6 >> 0x20);
  if (failures == L'\0') {
    if (verbosity == L'\xffffffff') {
      printf("\n");
    }
    printf("%d tests passed, no failures\n",(ulong)local_f4);
  }
  else {
    printf("\n");
    printf("Failing tests:\n");
    for (local_ec = 0; wVar1 = (wchar_t)((ulong)pcVar6 >> 0x20), (int)local_ec < 0x34;
        local_ec = local_ec + 1) {
      if (tests[(int)local_ec].failures != 0) {
        printf("  %d: %s (%d failures)\n",(ulong)local_ec,tests[(int)local_ec].name,
               (ulong)(uint)tests[(int)local_ec].failures);
      }
    }
    printf("\n");
    printf("Details for failing tests: %s\n",local_238);
    printf("\n");
  }
  free(pcVar7);
  assertion_chdir(in_stack_fffffffffffffba8,wVar1,in_stack_fffffffffffffb98);
  rmdir(local_238);
  return (uint)(local_f8 != 0);
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = sizeof(tests) / sizeof(tests[0]);
	int test_set[sizeof(tests) / sizeof(tests[0])];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	time_t now;
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
	char tmpdir[256], *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[256];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#ifdef PATH_MAX
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	if ((testprogdir = (char *)malloc(strlen(progname) + 1)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strcpy(testprogdir, progname);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = (char *)realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir));
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		if ((tmp2 = (char *)malloc(strlen(testprogdir) + 1 +
			strlen(PROGRAM) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strcpy(tmp2, testprogdir);
		strcat(tmp2, "/");
		strcat(tmp2, PROGRAM);
		testprogfile = tmp2;
	}

	{
		char *testprg;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg = malloc(strlen(testprogfile) + 3);
		strcpy(testprg, "\"");
		strcat(testprg, testprogfile);
		strcat(testprg, "\"");
		testprog = testprg;
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S",
		    localtime(&now));
		sprintf(tmpdir, "%s/%s.%s-%03d", tmp, progname,
		    tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir,0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv, tests);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
				return (1);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	return (tests_failed ? 1 : 0);
}